

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O0

uint MurmurHash3(uint nHashSeed,Span<const_unsigned_char> vDataToHash)

{
  long lVar1;
  _If_is_unsigned_integer<unsigned_int> _Var2;
  uint uVar3;
  size_t sVar4;
  uint in_EDI;
  long in_FS_OFFSET;
  uint32_t k1;
  uint8_t *tail;
  uint32_t k1_1;
  int i;
  uint8_t *blocks;
  int nblocks;
  uint32_t c2;
  uint32_t c1;
  uint32_t h1;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uchar *in_stack_ffffffffffffffa0;
  int local_3c;
  uint local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = Span<const_unsigned_char>::size
                    ((Span<const_unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Span<const_unsigned_char>::data
            ((Span<const_unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_20 = in_EDI;
  for (local_3c = 0; local_3c < (int)(sVar4 >> 2); local_3c = local_3c + 1) {
    ReadLE32(in_stack_ffffffffffffffa0);
    std::rotl<unsigned_int>(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    _Var2 = std::rotl<unsigned_int>(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_20 = _Var2 * 5 + 0xe6546b64;
  }
  Span<const_unsigned_char>::data
            ((Span<const_unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  sVar4 = Span<const_unsigned_char>::size
                    ((Span<const_unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  uVar3 = (uint)sVar4 & 3;
  if (((uVar3 == 1) || (uVar3 == 2)) || (uVar3 == 3)) {
    _Var2 = std::rotl<unsigned_int>(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_20 = _Var2 * 0x1b873593 ^ local_20;
  }
  sVar4 = Span<const_unsigned_char>::size
                    ((Span<const_unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_20 = local_20 ^ (uint)sVar4;
  uVar3 = (local_20 ^ local_20 >> 0x10) * -0x7a143595;
  uVar3 = (uVar3 ^ uVar3 >> 0xd) * -0x3d4d51cb;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3 ^ uVar3 >> 0x10;
}

Assistant:

unsigned int MurmurHash3(unsigned int nHashSeed, Span<const unsigned char> vDataToHash)
{
    // The following is MurmurHash3 (x86_32), see https://github.com/aappleby/smhasher/blob/master/src/MurmurHash3.cpp
    uint32_t h1 = nHashSeed;
    const uint32_t c1 = 0xcc9e2d51;
    const uint32_t c2 = 0x1b873593;

    const int nblocks = vDataToHash.size() / 4;

    //----------
    // body
    const uint8_t* blocks = vDataToHash.data();

    for (int i = 0; i < nblocks; ++i) {
        uint32_t k1 = ReadLE32(blocks + i*4);

        k1 *= c1;
        k1 = std::rotl(k1, 15);
        k1 *= c2;

        h1 ^= k1;
        h1 = std::rotl(h1, 13);
        h1 = h1 * 5 + 0xe6546b64;
    }

    //----------
    // tail
    const uint8_t* tail = vDataToHash.data() + nblocks * 4;

    uint32_t k1 = 0;

    switch (vDataToHash.size() & 3) {
        case 3:
            k1 ^= tail[2] << 16;
            [[fallthrough]];
        case 2:
            k1 ^= tail[1] << 8;
            [[fallthrough]];
        case 1:
            k1 ^= tail[0];
            k1 *= c1;
            k1 = std::rotl(k1, 15);
            k1 *= c2;
            h1 ^= k1;
    }

    //----------
    // finalization
    h1 ^= vDataToHash.size();
    h1 ^= h1 >> 16;
    h1 *= 0x85ebca6b;
    h1 ^= h1 >> 13;
    h1 *= 0xc2b2ae35;
    h1 ^= h1 >> 16;

    return h1;
}